

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

void mi_heap_delete(mi_heap_t *heap)

{
  mi_heap_t *heap1;
  _Bool _Var1;
  mi_heap_t *in_RDI;
  mi_heap_t *unaff_retaddr;
  mi_heap_t *bheap;
  
  if ((in_RDI != (mi_heap_t *)0x0) && (_Var1 = mi_heap_is_initialized(in_RDI), _Var1)) {
    heap1 = in_RDI->tld->heap_backing;
    if ((heap1 == in_RDI) || (_Var1 = mi_heaps_are_compatible(heap1,in_RDI), !_Var1)) {
      _mi_heap_collect_abandon((mi_heap_t *)0xb1dbbe);
    }
    else {
      mi_heap_absorb(heap,bheap);
    }
    mi_heap_free(unaff_retaddr);
  }
  return;
}

Assistant:

void mi_heap_delete(mi_heap_t* heap)
{
  mi_assert(heap != NULL);
  mi_assert(mi_heap_is_initialized(heap));
  mi_assert_expensive(mi_heap_is_valid(heap));
  if (heap==NULL || !mi_heap_is_initialized(heap)) return;

  mi_heap_t* bheap = heap->tld->heap_backing;
  if (bheap != heap && mi_heaps_are_compatible(bheap,heap)) {
    // transfer still used pages to the backing heap
    mi_heap_absorb(bheap, heap);
  }
  else {
    // the backing heap abandons its pages
    _mi_heap_collect_abandon(heap);
  }
  mi_assert_internal(heap->page_count==0);
  mi_heap_free(heap);
}